

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherical_quadrature.hpp
# Opt level: O1

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::
  quadrature_traits<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>,_void>
  ::generate(tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,
            Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>
            *r,Quadrature<IntegratorXX::Womersley<double>_> *a,point_type *cen)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  pointer pdVar9;
  long lVar10;
  long lVar11;
  tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_50;
  
  quadrature_traits<IntegratorXX::ProductQuadrature<IntegratorXX::detail::spherical_combine_op<double>,_IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_IntegratorXX::Womersley<double>_>,_void>
  ::generate(&local_50,r,a);
  lVar6 = (long)(a->
                super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super_QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                ).points_.
                super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    pdVar4 = (r->
             super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (r->
             super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
             ).points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar8 = (long)pdVar5 - (long)pdVar4 >> 3;
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    lVar10 = 0;
    pdVar9 = local_50.
             super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
             super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl
             .super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    do {
      if (pdVar5 != pdVar4) {
        lVar11 = 0;
        do {
          pdVar9[lVar11] = pdVar4[lVar11] * pdVar4[lVar11] * pdVar9[lVar11];
          lVar11 = lVar11 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar11);
      }
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + lVar8;
    } while (lVar10 != lVar6 + (ulong)(lVar6 == 0));
  }
  if ((long)local_50.
            super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
            .
            super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_50.
            super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
            .
            super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
            ._M_head_impl.
            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != 0) {
    dVar1 = cen->_M_elems[0];
    dVar2 = cen->_M_elems[1];
    dVar3 = cen->_M_elems[2];
    lVar6 = ((long)local_50.
                   super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.
                   super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                   .
                   super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    lVar6 = lVar6 + (ulong)(lVar6 == 0);
    pdVar7 = (local_50.
              super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              .
              super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_elems + 2;
    do {
      ((array<double,_3UL> *)(pdVar7 + -2))->_M_elems[0] =
           ((array<double,_3UL> *)(pdVar7 + -2))->_M_elems[0] + dVar1;
      pdVar7[-1] = pdVar7[-1] + dVar2;
      *pdVar7 = *pdVar7 + dVar3;
      pdVar7 = pdVar7 + 3;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,
             &local_50.
              super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              .
              super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
              ._M_head_impl,(vector<double,_std::allocator<double>_> *)&local_50);
  if (local_50.
      super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
      .
      super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
      ._M_head_impl.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    .
                    super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                    ._M_head_impl.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .
                          super__Head_base<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false>
                          ._M_head_impl.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.
      super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
      .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
      super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>._M_head_impl.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_50.
                    super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                    .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                    super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>.
                    _M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                          ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
                          .super__Tuple_impl<1UL,_std::vector<double,_std::allocator<double>_>_>.
                          super__Head_base<1UL,_std::vector<double,_std::allocator<double>_>,_false>
                          ._M_head_impl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( 
      const Quadrature<RadialQuad>&  r, 
      const Quadrature<AngularQuad>& a,
      const point_type&              cen
    ) {

    auto [points, weights] = prod_traits::generate(r, a); 

    const auto npr  = r.npts();
    const auto npa  = a.npts();

    const auto& rp = r.points();

    // Include Spherical Jacobian
    for( size_t j = 0; j < npa; ++j )
    for( size_t i = 0; i < npr; ++i ) {

      const auto ij = i + j * npr;
      weights[ij] *= rp[i] * rp[i];

    }

    // Recenter
    shift_grid( points, cen );

    return std::make_tuple( points, weights );

  }